

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeInternalForces
          (ChElementHexaANCF_3813 *this,ChVectorDynamic<> *Fi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer psVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ChVectorDynamic<> *pCVar44;
  ChMatrixNM<double,_8,_3> *d0_;
  void *pvVar45;
  ulong uVar46;
  undefined8 *puVar47;
  double *pdVar48;
  int ii;
  long lVar49;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  double detJ0C;
  double E;
  double v;
  ChVectorN<double,_9> alpha_eas;
  ChVectorN<double,_9> HE;
  ChVectorN<double,_9> ResidHE;
  ChMatrixNM<double,_9,_9> KALPHA1;
  ChMatrixNM<double,_8,_3> d;
  ChMatrixNM<double,_6,_6> T0;
  ChVectorN<double,_906> TempIntegratedResult;
  ChMatrixNM<double,_9,_9> INV_KALPHA;
  ChMatrixNM<double,_24,_24> stock_jac_EAS_elem;
  ChMatrixNM<double,_24,_24> KTE;
  Brick_ForceAnalytical myformula;
  double local_8bf8;
  ChVectorDynamic<> *local_8bf0;
  ChMatrixNM<double,_8,_3> *local_8be8;
  double local_8be0;
  double local_8bd8;
  double local_8bd0;
  double local_8bc8;
  undefined1 local_8bc0 [16];
  undefined1 auStack_8bb0 [16];
  undefined1 auStack_8ba0 [16];
  undefined1 auStack_8b90 [16];
  double local_8b80;
  undefined1 local_8b70 [16];
  double *local_8b60;
  variable_if_dynamic<long,__1> local_8b58;
  variable_if_dynamic<long,__1> local_8b50;
  Index local_8b48;
  Matrix<double,_9,_1,_0,_9,_1> local_8b40;
  undefined1 local_8ac0 [16];
  undefined1 local_8ab0 [16];
  undefined1 local_8aa0 [16];
  undefined1 local_8a90 [16];
  double local_8a80;
  double dStack_8a78;
  double local_8a70;
  double dStack_8a68;
  double local_8a60;
  double dStack_8a58;
  double local_8a50;
  double dStack_8a48;
  double local_8a40;
  double dStack_8a38;
  double local_8a30;
  double dStack_8a28;
  double local_8a20;
  double dStack_8a18;
  double local_8a10;
  double dStack_8a08;
  double local_8a00;
  double dStack_89f8;
  double local_89f0;
  double dStack_89e8;
  double local_89e0;
  double dStack_89d8;
  double local_89d0;
  double dStack_89c8;
  double local_89c0;
  double dStack_89b8;
  double local_89b0;
  double dStack_89a8;
  double local_89a0;
  double dStack_8998;
  double local_8990;
  double dStack_8988;
  double local_8980;
  double dStack_8978;
  double local_8970;
  double dStack_8968;
  double local_8960;
  double dStack_8958;
  double local_8950;
  double dStack_8948;
  double local_8940;
  double dStack_8938;
  double local_8930;
  double dStack_8928;
  double local_8920;
  double dStack_8918;
  double local_8910;
  double dStack_8908;
  double local_8900;
  double dStack_88f8;
  double local_88f0;
  double dStack_88e8;
  double local_88e0;
  double dStack_88d8;
  double local_88d0;
  double dStack_88c8;
  double local_88c0;
  double dStack_88b8;
  double local_88b0;
  double dStack_88a8;
  double local_88a0;
  double dStack_8898;
  double local_8890;
  double dStack_8888;
  double local_8880;
  double dStack_8878;
  double local_8870;
  double dStack_8868;
  double local_8860;
  double dStack_8858;
  double local_8850;
  double dStack_8848;
  double local_8840;
  double dStack_8838;
  double local_8830;
  double dStack_8828;
  double local_8820;
  double dStack_8818;
  double local_8810;
  double dStack_8808;
  Matrix<double,_9,_1,_0,_9,_1> local_8800;
  double local_87a0;
  double dStack_8798;
  double local_8790;
  double dStack_8788;
  double local_8780;
  double dStack_8778;
  double local_8770;
  double dStack_8768;
  double local_8760;
  double dStack_8758;
  double local_8750;
  double dStack_8748;
  double local_8740;
  double dStack_8738;
  double local_8730;
  double dStack_8728;
  double local_8720;
  double dStack_8718;
  double local_8710;
  double dStack_8708;
  double local_8700;
  double dStack_86f8;
  double local_86f0;
  double dStack_86e8;
  double local_86e0;
  double dStack_86d8;
  double local_86d0;
  double dStack_86c8;
  double local_86c0;
  double dStack_86b8;
  double local_86b0;
  double dStack_86a8;
  double local_86a0;
  double dStack_8698;
  double local_8690;
  double dStack_8688;
  double local_8680;
  double dStack_8678;
  double local_8670;
  double dStack_8668;
  double local_8660;
  double dStack_8658;
  double dStack_8650;
  double dStack_8648;
  double dStack_8640;
  double dStack_8638;
  double dStack_8630;
  double dStack_8628;
  double local_8620;
  double dStack_8618;
  double dStack_8610;
  double dStack_8608;
  double dStack_8600;
  double dStack_85f8;
  double dStack_85f0;
  double dStack_85e8;
  double local_85e0;
  double dStack_85d8;
  double dStack_85d0;
  double dStack_85c8;
  double dStack_85c0;
  double dStack_85b8;
  double dStack_85b0;
  double dStack_85a8;
  double local_85a0;
  double dStack_8598;
  double dStack_8590;
  double dStack_8588;
  double dStack_8580;
  double dStack_8578;
  double dStack_8570;
  double dStack_8568;
  double local_8560;
  double dStack_8558;
  double dStack_8550;
  double dStack_8548;
  double dStack_8540;
  double dStack_8538;
  double dStack_8530;
  double dStack_8528;
  double local_8520;
  double local_8510;
  double dStack_8508;
  double local_8500;
  double dStack_84f8;
  double local_84f0;
  double dStack_84e8;
  double local_84e0;
  double dStack_84d8;
  double local_84d0;
  double dStack_84c8;
  double local_84c0;
  double dStack_84b8;
  double local_84b0;
  double dStack_84a8;
  double local_84a0;
  double dStack_8498;
  double local_8490;
  double dStack_8488;
  double local_8480;
  double dStack_8478;
  double local_8470;
  double dStack_8468;
  double local_8460;
  double dStack_8458;
  double local_8450;
  double dStack_8448;
  double local_8440;
  double dStack_8438;
  double local_8430;
  double dStack_8428;
  double local_8420;
  double dStack_8418;
  double local_8410;
  double dStack_8408;
  double local_8400;
  double dStack_83f8;
  double local_83f0;
  double dStack_83e8;
  double local_83e0;
  double dStack_83d8;
  double local_83d0;
  double dStack_83c8;
  double local_83c0;
  double dStack_83b8;
  double local_83b0;
  double dStack_83a8;
  double local_83a0;
  double dStack_8398;
  double local_8390;
  double dStack_8388;
  double local_8380;
  double dStack_8378;
  double local_8370;
  double dStack_8368;
  double local_8360;
  double dStack_8358;
  double local_8350;
  double dStack_8348;
  double local_8340;
  double dStack_8338;
  double local_8330;
  double dStack_8328;
  double local_8320;
  double dStack_8318;
  double local_8310;
  double dStack_8308;
  double local_8300;
  double dStack_82f8;
  double local_82f0;
  double dStack_82e8;
  double local_82e0;
  double dStack_82d8;
  double local_82d0;
  double dStack_82c8;
  double local_82c0;
  double dStack_82b8;
  double local_82b0;
  double dStack_82a8;
  double local_82a0;
  double dStack_8298;
  double local_8290;
  double local_8280;
  double dStack_8278;
  double dStack_8270;
  double dStack_8268;
  double dStack_8260;
  double dStack_8258;
  double dStack_8250;
  double dStack_8248;
  double local_8240;
  double dStack_8238;
  double dStack_8230;
  double dStack_8228;
  double dStack_8220;
  double dStack_8218;
  double dStack_8210;
  double dStack_8208;
  double local_8200;
  double dStack_81f8;
  double dStack_81f0;
  double dStack_81e8;
  double dStack_81e0;
  double dStack_81d8;
  double dStack_81d0;
  double dStack_81c8;
  double local_81c0;
  double dStack_81b8;
  double dStack_81b0;
  double dStack_81a8;
  double dStack_81a0;
  double dStack_8198;
  double dStack_8190;
  double dStack_8188;
  double local_8180;
  double dStack_8178;
  double dStack_8170;
  double dStack_8168;
  double dStack_8160;
  double dStack_8158;
  double dStack_8150;
  double dStack_8148;
  double local_8140;
  double dStack_8138;
  double dStack_8130;
  double dStack_8128;
  double dStack_8120;
  double dStack_8118;
  double dStack_8110;
  double dStack_8108;
  double local_8100;
  double dStack_80f8;
  double dStack_80f0;
  double dStack_80e8;
  double dStack_80e0;
  double dStack_80d8;
  double dStack_80d0;
  double dStack_80c8;
  double local_80c0;
  double dStack_80b8;
  double dStack_80b0;
  double dStack_80a8;
  double dStack_80a0;
  double dStack_8098;
  double dStack_8090;
  double dStack_8088;
  double local_8080;
  double dStack_8078;
  double dStack_8070;
  double dStack_8068;
  double dStack_8060;
  double dStack_8058;
  double dStack_8050;
  double dStack_8048;
  double local_8040;
  double dStack_8038;
  double dStack_8030;
  double dStack_8028;
  double dStack_8020;
  double dStack_8018;
  double dStack_8010;
  double dStack_8008;
  double local_8000;
  double dStack_7ff8;
  double dStack_7ff0;
  double dStack_7fe8;
  double dStack_7fe0;
  double dStack_7fd8;
  double dStack_7fd0;
  double dStack_7fc8;
  double local_7fc0;
  double dStack_7fb8;
  double dStack_7fb0;
  double dStack_7fa8;
  double dStack_7fa0;
  double dStack_7f98;
  double dStack_7f90;
  double dStack_7f88;
  double local_7f80;
  double dStack_7f78;
  double dStack_7f70;
  double dStack_7f68;
  double dStack_7f60;
  double dStack_7f58;
  double dStack_7f50;
  double dStack_7f48;
  double local_7f40;
  double dStack_7f38;
  double dStack_7f30;
  double dStack_7f28;
  double dStack_7f20;
  double dStack_7f18;
  double dStack_7f10;
  double dStack_7f08;
  double local_7f00;
  double dStack_7ef8;
  double dStack_7ef0;
  double dStack_7ee8;
  double dStack_7ee0;
  double dStack_7ed8;
  double dStack_7ed0;
  double dStack_7ec8;
  double local_7ec0;
  double dStack_7eb8;
  double dStack_7eb0;
  double dStack_7ea8;
  double dStack_7ea0;
  double dStack_7e98;
  double dStack_7e90;
  double dStack_7e88;
  double local_7e80;
  double dStack_7e78;
  double dStack_7e70;
  double dStack_7e68;
  double dStack_7e60;
  double dStack_7e58;
  double dStack_7e50;
  double dStack_7e48;
  double local_7e40;
  double dStack_7e38;
  double dStack_7e30;
  double dStack_7e28;
  double dStack_7e20;
  double dStack_7e18;
  double dStack_7e10;
  double dStack_7e08;
  double local_7e00;
  double dStack_7df8;
  double dStack_7df0;
  double dStack_7de8;
  double dStack_7de0;
  double dStack_7dd8;
  double dStack_7dd0;
  double dStack_7dc8;
  double local_7dc0;
  double dStack_7db8;
  double dStack_7db0;
  double dStack_7da8;
  double dStack_7da0;
  double dStack_7d98;
  double dStack_7d90;
  double dStack_7d88;
  double local_7d80;
  double dStack_7d78;
  double dStack_7d70;
  double dStack_7d68;
  double dStack_7d60;
  double dStack_7d58;
  double dStack_7d50;
  double dStack_7d48;
  double local_7d40;
  double dStack_7d38;
  double dStack_7d30;
  double dStack_7d28;
  double dStack_7d20;
  double dStack_7d18;
  double dStack_7d10;
  double dStack_7d08;
  double local_7d00;
  double dStack_7cf8;
  double dStack_7cf0;
  double dStack_7ce8;
  double dStack_7ce0;
  double dStack_7cd8;
  double dStack_7cd0;
  double dStack_7cc8;
  double local_7cc0;
  double dStack_7cb8;
  double dStack_7cb0;
  double dStack_7ca8;
  double dStack_7ca0;
  double dStack_7c98;
  double dStack_7c90;
  double dStack_7c88;
  double local_7c80;
  double dStack_7c78;
  double dStack_7c70;
  double dStack_7c68;
  double dStack_7c60;
  double dStack_7c58;
  double dStack_7c50;
  double dStack_7c48;
  double local_7c40;
  double dStack_7c38;
  double dStack_7c30;
  double dStack_7c28;
  double dStack_7c20;
  double dStack_7c18;
  double dStack_7c10;
  double dStack_7c08;
  double local_7c00;
  double dStack_7bf8;
  double dStack_7bf0;
  double dStack_7be8;
  double dStack_7be0;
  double dStack_7bd8;
  double dStack_7bd0;
  double dStack_7bc8;
  double local_7bc0;
  double dStack_7bb8;
  double dStack_7bb0;
  double dStack_7ba8;
  double dStack_7ba0;
  double dStack_7b98;
  double dStack_7b90;
  double dStack_7b88;
  double local_7b80;
  double dStack_7b78;
  double dStack_7b70;
  double dStack_7b68;
  double dStack_7b60;
  double dStack_7b58;
  double dStack_7b50;
  double dStack_7b48;
  double local_7b40;
  double dStack_7b38;
  double dStack_7b30;
  double dStack_7b28;
  double dStack_7b20;
  double dStack_7b18;
  double dStack_7b10;
  double dStack_7b08;
  double local_7b00;
  double dStack_7af8;
  double dStack_7af0;
  double dStack_7ae8;
  double dStack_7ae0;
  double dStack_7ad8;
  double dStack_7ad0;
  double dStack_7ac8;
  double local_7ac0;
  double dStack_7ab8;
  double dStack_7ab0;
  double dStack_7aa8;
  double dStack_7aa0;
  double dStack_7a98;
  double dStack_7a90;
  double dStack_7a88;
  double local_7a80;
  double dStack_7a78;
  double dStack_7a70;
  double dStack_7a68;
  double dStack_7a60;
  double dStack_7a58;
  double dStack_7a50;
  double dStack_7a48;
  undefined1 local_7a40 [64];
  undefined1 local_7a00 [64];
  undefined1 local_79c0 [64];
  ChMatrixNM<double,_6,_6> local_7980;
  Matrix<double,_9,_24,_1,_9,_24> local_7840;
  Matrix<double,_906,_1,_0,_906,_1> local_7160;
  Matrix<double,_9,_9,_1,_9,_9> local_5508;
  Matrix<double,_9,_1,_0,_9,_1> local_5280;
  undefined8 auStack_5238 [122];
  undefined2 local_4e68;
  undefined8 local_4080 [560];
  undefined8 auStack_2f00 [16];
  Brick_ForceAnalytical local_2e80;
  
  psVar8 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar9 = (psVar8->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar10 = psVar8[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar11 = psVar8[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar12 = psVar8[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  peVar13 = psVar8[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)&peVar9->field_0x30;
  auVar50 = vbroadcastsd_avx512f(auVar1);
  auVar16 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((long)&peVar11->super_ChNodeFEAbase + 0x20)
                                 ),0xd0);
  peVar14 = psVar8[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar50 = vpermi2pd_avx512f(_DAT_00997ec0,
                              ZEXT2464(CONCAT816(auVar50._16_8_,
                                                 *(undefined1 (*) [16])
                                                  ((long)&peVar9->super_ChNodeFEAbase + 0x20))),
                              ZEXT1664(*(undefined1 (*) [16])
                                        ((long)&peVar10->super_ChNodeFEAbase + 0x20)));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)&peVar10->field_0x30;
  auVar51 = vbroadcastsd_avx512f(auVar2);
  auVar52._0_40_ = auVar50._0_40_;
  auVar52._40_8_ = auVar51._40_8_;
  auVar52._48_8_ = auVar50._48_8_;
  auVar52._56_8_ = auVar50._56_8_;
  local_7a40 = vinsertf32x4_avx512f
                         (auVar52,*(undefined1 (*) [16])((long)&peVar12->super_ChNodeFEAbase + 0x10)
                          ,3);
  auVar16 = vblendpd_avx(auVar16,ZEXT832(*(ulong *)&peVar12->field_0x30),1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)&peVar11->field_0x30;
  auVar50 = vbroadcastsd_avx512f(auVar3);
  peVar9 = psVar8[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar10 = psVar8[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  auVar50 = vinsertf32x4_avx512f
                      (ZEXT3264(CONCAT824(auVar50._24_8_,auVar16._0_24_)),
                       *(undefined1 (*) [16])((long)&peVar13->super_ChNodeFEAbase + 0x10),2);
  auVar51 = vinsertf32x4_avx512f
                      (ZEXT1664(*(undefined1 (*) [16])&peVar14->field_0x28),
                       *(undefined1 (*) [16])((long)&peVar9->super_ChNodeFEAbase + 0x10),1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)&peVar13->field_0x30;
  auVar52 = vbroadcastsd_avx512f(auVar4);
  local_7a00._48_8_ = auVar52._48_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)&peVar9->field_0x30;
  auVar52 = vbroadcastsd_avx512f(auVar5);
  auVar53._0_32_ = auVar51._0_32_;
  auVar53._32_8_ = auVar52._32_8_;
  auVar53._40_8_ = auVar51._40_8_;
  auVar53._48_8_ = auVar51._48_8_;
  auVar53._56_8_ = auVar51._56_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)((long)&peVar14->super_ChNodeFEAbase + 0x20);
  auVar51 = vbroadcastsd_avx512f(auVar6);
  local_7a00._0_48_ = auVar50._0_48_;
  local_7a00._56_8_ = auVar51._56_8_;
  auVar50 = vpermi2pd_avx512f(_DAT_00997f00,auVar53,
                              ZEXT1664(*(undefined1 (*) [16])
                                        ((long)&peVar10->super_ChNodeFEAbase + 0x20)));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)&peVar10->field_0x30;
  auVar51 = vbroadcastsd_avx512f(auVar7);
  local_79c0._56_8_ = auVar51._56_8_;
  local_79c0._0_56_ = auVar50._0_56_;
  peVar15 = (this->m_Material).
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_8bc8 = peVar15->v;
  local_8bd0 = peVar15->E;
  lVar49 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar49 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar49 != 0) {
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar49 << 3);
  }
  local_8bc0 = *(undefined1 (*) [16])
                (this->m_stock_alpha_EAS).
                super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array;
  auStack_8bb0 = *(undefined1 (*) [16])
                  ((this->m_stock_alpha_EAS).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array + 2);
  auStack_8ba0 = *(undefined1 (*) [16])
                  ((this->m_stock_alpha_EAS).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array + 4);
  auStack_8b90 = *(undefined1 (*) [16])
                  ((this->m_stock_alpha_EAS).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array + 6);
  local_8b80 = (this->m_stock_alpha_EAS).
               super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
               [8];
  local_8be8 = &this->m_d0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_8bf0 = Fi;
  while( true ) {
    d0_ = local_8be8;
    auVar40._8_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1];
    auVar40._0_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0];
    local_8bc0 = vsubpd_avx(local_8bc0,auVar40);
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [8] = 0.0;
    local_8520 = 0.0;
    local_8bf8 = 0.0;
    auVar41._8_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3];
    auVar41._0_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2];
    auStack_8bb0 = vsubpd_avx(auStack_8bb0,auVar41);
    auVar42._8_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5];
    auVar42._0_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4];
    auStack_8ba0 = vsubpd_avx(auStack_8ba0,auVar42);
    auVar43._8_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7];
    auVar43._0_8_ =
         local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6];
    auStack_8b90 = vsubpd_avx(auStack_8b90,auVar43);
    local_8be0 = local_8b80 -
                 local_8800.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                 m_data.array[8];
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x20] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x21] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x22] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x23] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [3] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [4] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [5] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [6] = 0.0;
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [7] = 0.0;
    local_8560 = 0.0;
    dStack_8558 = 0.0;
    dStack_8550 = 0.0;
    dStack_8548 = 0.0;
    dStack_8540 = 0.0;
    dStack_8538 = 0.0;
    dStack_8530 = 0.0;
    dStack_8528 = 0.0;
    local_85a0 = 0.0;
    dStack_8598 = 0.0;
    dStack_8590 = 0.0;
    dStack_8588 = 0.0;
    dStack_8580 = 0.0;
    dStack_8578 = 0.0;
    dStack_8570 = 0.0;
    dStack_8568 = 0.0;
    local_85e0 = 0.0;
    dStack_85d8 = 0.0;
    dStack_85d0 = 0.0;
    dStack_85c8 = 0.0;
    dStack_85c0 = 0.0;
    dStack_85b8 = 0.0;
    dStack_85b0 = 0.0;
    dStack_85a8 = 0.0;
    local_8620 = 0.0;
    dStack_8618 = 0.0;
    dStack_8610 = 0.0;
    dStack_8608 = 0.0;
    dStack_8600 = 0.0;
    dStack_85f8 = 0.0;
    dStack_85f0 = 0.0;
    dStack_85e8 = 0.0;
    local_8660 = 0.0;
    dStack_8658 = 0.0;
    dStack_8650 = 0.0;
    dStack_8648 = 0.0;
    dStack_8640 = 0.0;
    dStack_8638 = 0.0;
    dStack_8630 = 0.0;
    dStack_8628 = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x18] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x19] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1a] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1b] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1c] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1d] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1e] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1f] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x10] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x11] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x12] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x13] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x14] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x15] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x16] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x17] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [8] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [9] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [10] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xb] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xc] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xd] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xe] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [1] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [2] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [3] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [4] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [5] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [6] = 0.0;
    local_7980.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [7] = 0.0;
    local_8b80 = local_8be0;
    local_8ac0 = auStack_8b90;
    local_8ab0 = auStack_8bb0;
    local_8aa0 = auStack_8ba0;
    local_8a90 = local_8bc0;
    T0DetJElementCenterForEAS(this,local_8be8,&local_7980,&local_8bf8);
    if (this->m_isMooney == false) {
      Brick_ForceAnalytical::Brick_ForceAnalytical
                (&local_2e80,(ChMatrixNM<double,_8,_3> *)local_7a40,d0_,this,&local_7980,&local_8bf8
                 ,(ChVectorN<double,_9> *)local_8bc0,&local_8bd0,&local_8bc8);
    }
    else {
      Brick_ForceAnalytical::Brick_ForceAnalytical
                (&local_2e80,(ChMatrixNM<double,_8,_3> *)local_7a40,d0_,this,&local_7980,&local_8bf8
                 ,(ChVectorN<double,_9> *)local_8bc0);
    }
    memset(&local_7160,0,0x1c50);
    ChQuadrature::Integrate3D<Eigen::Matrix<double,906,1,0,906,1>>
              (&local_7160,
               &local_2e80.super_ChIntegrable3D<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>,-1.0,1.0,
               -1.0,1.0,-1.0,1.0,2);
    local_8240 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[8];
    dStack_8238 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[9];
    dStack_8230 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[10];
    dStack_8228 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb];
    dStack_8220 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc];
    dStack_8218 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd];
    dStack_8210 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe];
    dStack_8208 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf];
    local_8a80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xf9];
    dStack_8a78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xfa];
    local_8200 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10];
    dStack_81f8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11];
    dStack_81f0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x12];
    dStack_81e8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13];
    dStack_81e0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x14];
    dStack_81d8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x15];
    dStack_81d0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x16];
    dStack_81c8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x17];
    local_8280 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0];
    dStack_8278 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[1];
    dStack_8270 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[2];
    dStack_8268 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[3];
    dStack_8260 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[4];
    dStack_8258 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[5];
    dStack_8250 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[6];
    dStack_8248 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[7];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x18];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [1] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x19];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [2] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1a];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [3] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1b];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [4] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1c];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [5] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1d];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [6] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1e];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [7] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1f];
    local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [8] = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x20];
    local_8a60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xfd];
    dStack_8a58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xfe];
    local_7a80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x21];
    dStack_7a78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x22];
    dStack_7a70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x23];
    dStack_7a68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x24];
    dStack_7a60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x25];
    dStack_7a58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x26];
    dStack_7a50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x27];
    dStack_7a48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x28];
    local_8a70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xfb];
    dStack_8a68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xfc];
    local_8a40 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x101];
    dStack_8a38 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x102];
    local_7ac0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x29];
    dStack_7ab8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x2a];
    dStack_7ab0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x2b];
    dStack_7aa8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x2c];
    dStack_7aa0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x2d];
    dStack_7a98 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x2e];
    dStack_7a90 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x2f];
    dStack_7a88 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x30];
    local_7b00 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x31];
    dStack_7af8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x32];
    dStack_7af0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x33];
    dStack_7ae8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x34];
    dStack_7ae0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x35];
    dStack_7ad8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x36];
    dStack_7ad0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x37];
    dStack_7ac8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x38];
    local_8a50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xff];
    dStack_8a48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x100];
    local_8a20 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x105];
    dStack_8a18 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x106];
    local_7b40 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x39];
    dStack_7b38 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x3a];
    dStack_7b30 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x3b];
    dStack_7b28 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x3c];
    dStack_7b20 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x3d];
    dStack_7b18 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x3e];
    dStack_7b10 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x3f];
    dStack_7b08 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x40];
    local_7b80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x41];
    dStack_7b78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x42];
    dStack_7b70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x43];
    dStack_7b68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x44];
    dStack_7b60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x45];
    dStack_7b58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x46];
    dStack_7b50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x47];
    dStack_7b48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x48];
    local_8a30 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x103];
    dStack_8a28 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x104];
    local_8a00 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x109];
    dStack_89f8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x10a];
    local_7bc0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x49];
    dStack_7bb8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x4a];
    dStack_7bb0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x4b];
    dStack_7ba8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x4c];
    dStack_7ba0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x4d];
    dStack_7b98 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x4e];
    dStack_7b90 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x4f];
    dStack_7b88 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x50];
    local_7c00 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x51];
    dStack_7bf8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x52];
    dStack_7bf0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x53];
    dStack_7be8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x54];
    dStack_7be0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x55];
    dStack_7bd8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x56];
    dStack_7bd0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x57];
    dStack_7bc8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x58];
    local_8a10 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x107];
    dStack_8a08 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x108];
    local_89e0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10d];
    dStack_89d8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x10e];
    local_7c40 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x59];
    dStack_7c38 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x5a];
    dStack_7c30 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x5b];
    dStack_7c28 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x5c];
    dStack_7c20 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x5d];
    dStack_7c18 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x5e];
    dStack_7c10 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x5f];
    dStack_7c08 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x60];
    local_7c80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x61];
    dStack_7c78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x62];
    dStack_7c70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[99];
    dStack_7c68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[100];
    dStack_7c60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x65];
    dStack_7c58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x66];
    dStack_7c50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x67];
    dStack_7c48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x68];
    local_89f0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10b];
    dStack_89e8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x10c];
    local_89c0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x111];
    dStack_89b8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x112];
    local_7cc0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x69];
    dStack_7cb8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x6a];
    dStack_7cb0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x6b];
    dStack_7ca8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x6c];
    dStack_7ca0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x6d];
    dStack_7c98 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x6e];
    dStack_7c90 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x6f];
    dStack_7c88 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x70];
    local_7d00 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x71];
    dStack_7cf8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x72];
    dStack_7cf0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x73];
    dStack_7ce8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x74];
    dStack_7ce0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x75];
    dStack_7cd8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x76];
    dStack_7cd0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x77];
    dStack_7cc8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x78];
    local_89d0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10f];
    dStack_89c8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x110];
    local_89a0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x115];
    dStack_8998 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x116];
    local_7d40 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x79];
    dStack_7d38 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7a];
    dStack_7d30 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7b];
    dStack_7d28 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7c];
    dStack_7d20 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7d];
    dStack_7d18 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7e];
    dStack_7d10 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7f];
    dStack_7d08 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x80];
    local_7d80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x81];
    dStack_7d78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x82];
    dStack_7d70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x83];
    dStack_7d68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x84];
    dStack_7d60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x85];
    dStack_7d58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x86];
    dStack_7d50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x87];
    dStack_7d48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x88];
    local_89b0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x113];
    dStack_89a8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x114];
    local_8980 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x119];
    dStack_8978 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11a];
    local_7dc0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x89];
    dStack_7db8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8a];
    dStack_7db0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8b];
    dStack_7da8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8c];
    dStack_7da0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8d];
    dStack_7d98 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8e];
    dStack_7d90 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8f];
    dStack_7d88 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x90];
    local_7e00 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x91];
    dStack_7df8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x92];
    dStack_7df0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x93];
    dStack_7de8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x94];
    dStack_7de0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x95];
    dStack_7dd8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x96];
    dStack_7dd0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x97];
    dStack_7dc8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x98];
    local_8990 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x117];
    dStack_8988 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x118];
    local_8960 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x11d];
    dStack_8958 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11e];
    local_7e40 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x99];
    dStack_7e38 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9a];
    dStack_7e30 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9b];
    dStack_7e28 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9c];
    dStack_7e20 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9d];
    dStack_7e18 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9e];
    dStack_7e10 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9f];
    dStack_7e08 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa0];
    local_7e80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xa1];
    dStack_7e78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa2];
    dStack_7e70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa3];
    dStack_7e68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa4];
    dStack_7e60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa5];
    dStack_7e58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa6];
    dStack_7e50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa7];
    dStack_7e48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa8];
    local_8970 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x11b];
    dStack_8968 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11c];
    local_8940 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x121];
    dStack_8938 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x122];
    local_7ec0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xa9];
    dStack_7eb8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xaa];
    dStack_7eb0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xab];
    dStack_7ea8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xac];
    dStack_7ea0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xad];
    dStack_7e98 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xae];
    dStack_7e90 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xaf];
    dStack_7e88 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb0];
    local_7f00 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xb1];
    dStack_7ef8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb2];
    dStack_7ef0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb3];
    dStack_7ee8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb4];
    dStack_7ee0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb5];
    dStack_7ed8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb6];
    dStack_7ed0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb7];
    dStack_7ec8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb8];
    local_8950 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x11f];
    dStack_8948 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x120];
    local_8920 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x125];
    dStack_8918 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x126];
    local_7f40 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xb9];
    dStack_7f38 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xba];
    dStack_7f30 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbb];
    dStack_7f28 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbc];
    dStack_7f20 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbd];
    dStack_7f18 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbe];
    dStack_7f10 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbf];
    dStack_7f08 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc0];
    local_7f80 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xc1];
    dStack_7f78 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc2];
    dStack_7f70 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc3];
    dStack_7f68 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc4];
    dStack_7f60 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc5];
    dStack_7f58 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc6];
    dStack_7f50 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[199];
    dStack_7f48 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[200];
    local_8930 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x123];
    dStack_8928 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x124];
    local_8900 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x129];
    dStack_88f8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x12a];
    local_7fc0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xc9];
    dStack_7fb8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xca];
    dStack_7fb0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcb];
    dStack_7fa8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcc];
    dStack_7fa0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcd];
    dStack_7f98 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xce];
    dStack_7f90 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcf];
    dStack_7f88 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd0];
    local_8000 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xd1];
    dStack_7ff8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd2];
    dStack_7ff0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd3];
    dStack_7fe8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd4];
    dStack_7fe0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd5];
    dStack_7fd8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd6];
    dStack_7fd0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd7];
    dStack_7fc8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd8];
    local_8910 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x127];
    dStack_8908 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x128];
    local_88e0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x12d];
    dStack_88d8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x12e];
    local_8040 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xd9];
    dStack_8038 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xda];
    dStack_8030 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdb];
    dStack_8028 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdc];
    dStack_8020 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdd];
    dStack_8018 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xde];
    dStack_8010 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdf];
    dStack_8008 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe0];
    local_8080 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xe1];
    dStack_8078 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe2];
    dStack_8070 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe3];
    dStack_8068 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe4];
    dStack_8060 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe5];
    dStack_8058 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe6];
    dStack_8050 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe7];
    dStack_8048 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe8];
    local_88f0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[299];
    dStack_88e8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[300];
    local_88c0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x131];
    dStack_88b8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x132];
    local_80c0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xe9];
    dStack_80b8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xea];
    dStack_80b0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xeb];
    dStack_80a8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xec];
    dStack_80a0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xed];
    dStack_8098 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xee];
    dStack_8090 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xef];
    dStack_8088 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf0];
    local_8100 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xf1];
    dStack_80f8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf2];
    dStack_80f0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf3];
    dStack_80e8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf4];
    dStack_80e0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf5];
    dStack_80d8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf6];
    dStack_80d0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf7];
    dStack_80c8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf8];
    local_88d0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x12f];
    dStack_88c8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x130];
    local_88a0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x135];
    dStack_8898 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x136];
    local_88b0 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x133];
    dStack_88a8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x134];
    local_8880 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x139];
    dStack_8878 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13a];
    local_8890 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x137];
    dStack_8888 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x138];
    local_8860 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x13d];
    dStack_8858 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13e];
    local_8870 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x13b];
    dStack_8868 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13c];
    local_8840 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x141];
    dStack_8838 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x142];
    local_8850 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x13f];
    dStack_8848 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x140];
    local_8820 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x145];
    dStack_8818 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x146];
    local_8830 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x143];
    dStack_8828 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x144];
    local_8bd8 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x149];
    local_8810 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x147];
    dStack_8808 = local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x148];
    memcpy(local_4080,
           local_7160.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
           m_data.array + 0x14a,0x1200);
    pCVar44 = local_8bf0;
    local_87a0 = local_8a80;
    dStack_8798 = dStack_8a78;
    local_8510 = local_8a80;
    dStack_8508 = dStack_8a78;
    local_8790 = local_8a70;
    dStack_8788 = dStack_8a68;
    local_8500 = local_8a70;
    dStack_84f8 = dStack_8a68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0] = local_7a80;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [1] = dStack_7a78;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [2] = dStack_7a70;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [3] = dStack_7a68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [4] = dStack_7a60;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [5] = dStack_7a58;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [6] = dStack_7a50;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [7] = dStack_7a48;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [8] = local_7ac0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [9] = dStack_7ab8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [10] = dStack_7ab0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb] = dStack_7aa8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc] = dStack_7aa0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd] = dStack_7a98;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xe] = dStack_7a90;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xf] = dStack_7a88;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x10] = local_7b00;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x11] = dStack_7af8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x12] = dStack_7af0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x13] = dStack_7ae8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x14] = dStack_7ae0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x15] = dStack_7ad8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x16] = dStack_7ad0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x17] = dStack_7ac8;
    local_8780 = local_8a60;
    dStack_8778 = dStack_8a58;
    local_84f0 = local_8a60;
    dStack_84e8 = dStack_8a58;
    local_8770 = local_8a50;
    dStack_8768 = dStack_8a48;
    local_84e0 = local_8a50;
    dStack_84d8 = dStack_8a48;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x18] = local_7b40;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x19] = dStack_7b38;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x1a] = dStack_7b30;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x1b] = dStack_7b28;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x1c] = dStack_7b20;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x1d] = dStack_7b18;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x1e] = dStack_7b10;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x1f] = dStack_7b08;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x20] = local_7b80;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x21] = dStack_7b78;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x22] = dStack_7b70;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x23] = dStack_7b68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x24] = dStack_7b60;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x25] = dStack_7b58;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x26] = dStack_7b50;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x27] = dStack_7b48;
    local_8760 = local_8a40;
    dStack_8758 = dStack_8a38;
    local_84d0 = local_8a40;
    dStack_84c8 = dStack_8a38;
    local_8750 = local_8a30;
    dStack_8748 = dStack_8a28;
    local_84c0 = local_8a30;
    dStack_84b8 = dStack_8a28;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x28] = local_7bc0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x29] = dStack_7bb8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x2a] = dStack_7bb0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x2b] = dStack_7ba8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x2c] = dStack_7ba0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x2d] = dStack_7b98;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x2e] = dStack_7b90;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x2f] = dStack_7b88;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x30] = local_7c00;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x31] = dStack_7bf8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x32] = dStack_7bf0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x33] = dStack_7be8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x34] = dStack_7be0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x35] = dStack_7bd8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x36] = dStack_7bd0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x37] = dStack_7bc8;
    local_8740 = local_8a20;
    dStack_8738 = dStack_8a18;
    local_84b0 = local_8a20;
    dStack_84a8 = dStack_8a18;
    local_8730 = local_8a10;
    dStack_8728 = dStack_8a08;
    local_84a0 = local_8a10;
    dStack_8498 = dStack_8a08;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x38] = local_7c40;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x39] = dStack_7c38;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x3a] = dStack_7c30;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x3b] = dStack_7c28;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x3c] = dStack_7c20;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x3d] = dStack_7c18;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x3e] = dStack_7c10;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x3f] = dStack_7c08;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x40] = local_7c80;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x41] = dStack_7c78;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x42] = dStack_7c70;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x43] = dStack_7c68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x44] = dStack_7c60;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x45] = dStack_7c58;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x46] = dStack_7c50;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x47] = dStack_7c48;
    local_8720 = local_8a00;
    dStack_8718 = dStack_89f8;
    local_8490 = local_8a00;
    dStack_8488 = dStack_89f8;
    local_8710 = local_89f0;
    dStack_8708 = dStack_89e8;
    local_8480 = local_89f0;
    dStack_8478 = dStack_89e8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x48] = local_7cc0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x49] = dStack_7cb8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x4a] = dStack_7cb0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x4b] = dStack_7ca8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x4c] = dStack_7ca0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x4d] = dStack_7c98;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x4e] = dStack_7c90;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x4f] = dStack_7c88;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x50] = local_7d00;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x51] = dStack_7cf8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x52] = dStack_7cf0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x53] = dStack_7ce8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x54] = dStack_7ce0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x55] = dStack_7cd8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x56] = dStack_7cd0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x57] = dStack_7cc8;
    local_8700 = local_89e0;
    dStack_86f8 = dStack_89d8;
    local_8470 = local_89e0;
    dStack_8468 = dStack_89d8;
    local_86f0 = local_89d0;
    dStack_86e8 = dStack_89c8;
    local_8460 = local_89d0;
    dStack_8458 = dStack_89c8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x58] = local_7d40;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x59] = dStack_7d38;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x5a] = dStack_7d30;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x5b] = dStack_7d28;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x5c] = dStack_7d20;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x5d] = dStack_7d18;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x5e] = dStack_7d10;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x5f] = dStack_7d08;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x60] = local_7d80;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x61] = dStack_7d78;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x62] = dStack_7d70;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [99] = dStack_7d68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [100] = dStack_7d60;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x65] = dStack_7d58;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x66] = dStack_7d50;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x67] = dStack_7d48;
    local_86e0 = local_89c0;
    dStack_86d8 = dStack_89b8;
    local_8450 = local_89c0;
    dStack_8448 = dStack_89b8;
    local_86d0 = local_89b0;
    dStack_86c8 = dStack_89a8;
    local_8440 = local_89b0;
    dStack_8438 = dStack_89a8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x68] = local_7dc0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x69] = dStack_7db8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x6a] = dStack_7db0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x6b] = dStack_7da8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x6c] = dStack_7da0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x6d] = dStack_7d98;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x6e] = dStack_7d90;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x6f] = dStack_7d88;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x70] = local_7e00;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x71] = dStack_7df8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x72] = dStack_7df0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x73] = dStack_7de8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x74] = dStack_7de0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x75] = dStack_7dd8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x76] = dStack_7dd0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x77] = dStack_7dc8;
    local_86c0 = local_89a0;
    dStack_86b8 = dStack_8998;
    local_8430 = local_89a0;
    dStack_8428 = dStack_8998;
    local_86b0 = local_8990;
    dStack_86a8 = dStack_8988;
    local_8420 = local_8990;
    dStack_8418 = dStack_8988;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x78] = local_7e40;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x79] = dStack_7e38;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x7a] = dStack_7e30;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x7b] = dStack_7e28;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x7c] = dStack_7e20;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x7d] = dStack_7e18;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x7e] = dStack_7e10;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x7f] = dStack_7e08;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x80] = local_7e80;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x81] = dStack_7e78;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x82] = dStack_7e70;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x83] = dStack_7e68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x84] = dStack_7e60;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x85] = dStack_7e58;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x86] = dStack_7e50;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x87] = dStack_7e48;
    local_86a0 = local_8980;
    dStack_8698 = dStack_8978;
    local_8410 = local_8980;
    dStack_8408 = dStack_8978;
    local_8690 = local_8970;
    dStack_8688 = dStack_8968;
    local_8400 = local_8970;
    dStack_83f8 = dStack_8968;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x88] = local_7ec0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x89] = dStack_7eb8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x8a] = dStack_7eb0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x8b] = dStack_7ea8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x8c] = dStack_7ea0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x8d] = dStack_7e98;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x8e] = dStack_7e90;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x8f] = dStack_7e88;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x90] = local_7f00;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x91] = dStack_7ef8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x92] = dStack_7ef0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x93] = dStack_7ee8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x94] = dStack_7ee0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x95] = dStack_7ed8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x96] = dStack_7ed0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x97] = dStack_7ec8;
    local_8680 = local_8960;
    dStack_8678 = dStack_8958;
    local_83f0 = local_8960;
    dStack_83e8 = dStack_8958;
    local_8670 = local_8950;
    dStack_8668 = dStack_8948;
    local_83e0 = local_8950;
    dStack_83d8 = dStack_8948;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x98] = local_7f40;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x99] = dStack_7f38;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x9a] = dStack_7f30;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x9b] = dStack_7f28;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x9c] = dStack_7f20;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x9d] = dStack_7f18;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x9e] = dStack_7f10;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0x9f] = dStack_7f08;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa0] = local_7f80;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa1] = dStack_7f78;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa2] = dStack_7f70;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa3] = dStack_7f68;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa4] = dStack_7f60;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa5] = dStack_7f58;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa6] = dStack_7f50;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa7] = dStack_7f48;
    local_8660 = local_8940;
    dStack_8658 = dStack_8938;
    local_83d0 = local_8940;
    dStack_83c8 = dStack_8938;
    dStack_8650 = local_8930;
    dStack_8648 = dStack_8928;
    local_83c0 = local_8930;
    dStack_83b8 = dStack_8928;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa8] = local_7fc0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xa9] = dStack_7fb8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xaa] = dStack_7fb0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xab] = dStack_7fa8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xac] = dStack_7fa0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xad] = dStack_7f98;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xae] = dStack_7f90;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xaf] = dStack_7f88;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb0] = local_8000;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb1] = dStack_7ff8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb2] = dStack_7ff0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb3] = dStack_7fe8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb4] = dStack_7fe0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb5] = dStack_7fd8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb6] = dStack_7fd0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb7] = dStack_7fc8;
    dStack_8640 = local_8920;
    dStack_8638 = dStack_8918;
    local_83b0 = local_8920;
    dStack_83a8 = dStack_8918;
    dStack_8630 = local_8910;
    dStack_8628 = dStack_8908;
    local_83a0 = local_8910;
    dStack_8398 = dStack_8908;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb8] = local_8040;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xb9] = dStack_8038;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xba] = dStack_8030;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xbb] = dStack_8028;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xbc] = dStack_8020;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xbd] = dStack_8018;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xbe] = dStack_8010;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xbf] = dStack_8008;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc0] = local_8080;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc1] = dStack_8078;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc2] = dStack_8070;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc3] = dStack_8068;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc4] = dStack_8060;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc5] = dStack_8058;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc6] = dStack_8050;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [199] = dStack_8048;
    local_8620 = local_8900;
    dStack_8618 = dStack_88f8;
    local_8390 = local_8900;
    dStack_8388 = dStack_88f8;
    dStack_8610 = local_88f0;
    dStack_8608 = dStack_88e8;
    local_8380 = local_88f0;
    dStack_8378 = dStack_88e8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [200] = local_80c0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xc9] = dStack_80b8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xca] = dStack_80b0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xcb] = dStack_80a8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xcc] = dStack_80a0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xcd] = dStack_8098;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xce] = dStack_8090;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xcf] = dStack_8088;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd0] = local_8100;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd1] = dStack_80f8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd2] = dStack_80f0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd3] = dStack_80e8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd4] = dStack_80e0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd5] = dStack_80d8;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd6] = dStack_80d0;
    local_7840.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
    [0xd7] = dStack_80c8;
    dStack_8600 = local_88e0;
    dStack_85f8 = dStack_88d8;
    local_8370 = local_88e0;
    dStack_8368 = dStack_88d8;
    dStack_85f0 = local_88d0;
    dStack_85e8 = dStack_88c8;
    local_8360 = local_88d0;
    dStack_8358 = dStack_88c8;
    local_85e0 = local_88c0;
    dStack_85d8 = dStack_88b8;
    local_8350 = local_88c0;
    dStack_8348 = dStack_88b8;
    dStack_85d0 = local_88b0;
    dStack_85c8 = dStack_88a8;
    local_8340 = local_88b0;
    dStack_8338 = dStack_88a8;
    dStack_85c0 = local_88a0;
    dStack_85b8 = dStack_8898;
    local_8330 = local_88a0;
    dStack_8328 = dStack_8898;
    dStack_85b0 = local_8890;
    dStack_85a8 = dStack_8888;
    local_8320 = local_8890;
    dStack_8318 = dStack_8888;
    local_85a0 = local_8880;
    dStack_8598 = dStack_8878;
    local_8310 = local_8880;
    dStack_8308 = dStack_8878;
    dStack_8590 = local_8870;
    dStack_8588 = dStack_8868;
    local_8300 = local_8870;
    dStack_82f8 = dStack_8868;
    dStack_8580 = local_8860;
    dStack_8578 = dStack_8858;
    local_82f0 = local_8860;
    dStack_82e8 = dStack_8858;
    dStack_8570 = local_8850;
    dStack_8568 = dStack_8848;
    local_82e0 = local_8850;
    dStack_82d8 = dStack_8848;
    local_8560 = local_8840;
    dStack_8558 = dStack_8838;
    local_82d0 = local_8840;
    dStack_82c8 = dStack_8838;
    dStack_8550 = local_8830;
    dStack_8548 = dStack_8828;
    local_82c0 = local_8830;
    dStack_82b8 = dStack_8828;
    dStack_8540 = local_8820;
    dStack_8538 = dStack_8818;
    local_82b0 = local_8820;
    dStack_82a8 = dStack_8818;
    dStack_8530 = local_8810;
    dStack_8528 = dStack_8808;
    local_82a0 = local_8810;
    dStack_8298 = dStack_8808;
    local_8520 = local_8bd8;
    local_8290 = local_8bd8;
    if ((this->m_flag_HE == NUMERICAL) ||
       (auVar54._8_8_ = 0,
       auVar54._0_8_ =
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[8] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[8] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[0] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[0] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[2] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[2] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[4] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[4] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[6] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[6] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[1] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[1] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[3] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[3] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[5] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[5] +
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[7] *
            local_8b40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[7], auVar1 = vsqrtsd_avx(auVar54,auVar54), auVar1._0_8_ < 1e-05)) break;
    local_4e68 = 0;
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
    compute<Eigen::Matrix<double,9,9,1,9,9>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)&local_5280,
               (EigenBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_8510);
    if ((char)local_4e68 == '\0') {
      local_81c0 = local_8280;
      dStack_81b8 = dStack_8278;
      dStack_81b0 = dStack_8270;
      dStack_81a8 = dStack_8268;
      dStack_81a0 = dStack_8260;
      dStack_8198 = dStack_8258;
      dStack_8190 = dStack_8250;
      dStack_8188 = dStack_8248;
      local_8180 = local_8240;
      dStack_8178 = dStack_8238;
      dStack_8170 = dStack_8230;
      dStack_8168 = dStack_8228;
      dStack_8160 = dStack_8220;
      dStack_8158 = dStack_8218;
      dStack_8150 = dStack_8210;
      dStack_8148 = dStack_8208;
      local_8140 = local_8200;
      dStack_8138 = dStack_81f8;
      dStack_8130 = dStack_81f0;
      dStack_8128 = dStack_81e8;
      dStack_8120 = dStack_81e0;
      dStack_8118 = dStack_81d8;
      dStack_8110 = dStack_81d0;
      dStack_8108 = dStack_81c8;
LAB_006c7fca:
      __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                    "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 9, 9, 1>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 9, 9, 1>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 9, 1>>]"
                   );
    }
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
    _solve_impl<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Matrix<double,9,1,0,9,1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)&local_5280,&local_8b40,
               &local_8800);
  }
  local_81c0 = local_8280;
  dStack_81b8 = dStack_8278;
  dStack_81b0 = dStack_8270;
  dStack_81a8 = dStack_8268;
  dStack_81a0 = dStack_8260;
  dStack_8198 = dStack_8258;
  dStack_8190 = dStack_8250;
  dStack_8188 = dStack_8248;
  local_8180 = local_8240;
  dStack_8178 = dStack_8238;
  dStack_8170 = dStack_8230;
  dStack_8168 = dStack_8228;
  dStack_8160 = dStack_8220;
  dStack_8158 = dStack_8218;
  dStack_8150 = dStack_8210;
  dStack_8148 = dStack_8208;
  local_8140 = local_8200;
  dStack_8138 = dStack_81f8;
  dStack_8130 = dStack_81f0;
  dStack_8128 = dStack_81e8;
  dStack_8120 = dStack_81e0;
  dStack_8118 = dStack_81d8;
  dStack_8110 = dStack_81d0;
  dStack_8108 = dStack_81c8;
  pdVar48 = (local_8bf0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  if ((local_8bf0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      != 0x18) {
    if (pdVar48 != (double *)0x0) {
      free((void *)pdVar48[-1]);
    }
    pvVar45 = malloc(0x100);
    if (pvVar45 == (void *)0x0) {
      puVar47 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar47 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar47,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar45 & 0xffffffffffffffc0) + 0x38) = pvVar45;
    pdVar48 = (double *)(((ulong)pvVar45 & 0xffffffffffffffc0) + 0x40);
    (pCVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar48;
    (pCVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
         0x18;
  }
  uVar46 = 0xfffffffffffffff8;
  do {
    auVar50 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(&local_8180 + uVar46));
    *(undefined1 (*) [64])(pdVar48 + uVar46 + 8) = auVar50;
    uVar46 = uVar46 + 8;
  } while (uVar46 < 0x10);
  if (this->m_flag_HE != ANALYTICAL) {
    return;
  }
  lVar49 = 0;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[0] = (double)local_8a90._0_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[1] = (double)local_8a90._8_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[2] = (double)local_8ab0._0_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[3] = (double)local_8ab0._8_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[6] = (double)local_8ac0._0_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[7] = (double)local_8ac0._8_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[4] = (double)local_8aa0._0_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[5] = (double)local_8aa0._8_8_;
  (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[8] = local_8be0;
  pdVar48 = (double *)&local_5508;
  while( true ) {
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [8] = 0.0;
    local_2e80.JAC11.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
    m_data.array[0x5b]._0_2_ = 0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [3] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [4] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [5] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [6] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [7] = 0.0;
    local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [lVar49] = 1.0;
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
    compute<Eigen::Matrix<double,9,9,1,9,9>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)&local_2e80,
               (EigenBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_87a0);
    if (local_2e80.JAC11.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
        m_data.array[0x5b]._0_1_ == '\0') break;
    local_8b58.m_value = 0;
    local_8b48 = 1;
    local_8b70._0_8_ = pdVar48;
    local_8b60 = (double *)&local_5508;
    local_8b50.m_value = lVar49;
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
    _solve_impl<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,9,1,false>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)&local_2e80,&local_5280,
               (Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_9,_1,_false> *)local_8b70);
    lVar49 = lVar49 + 1;
    pdVar48 = pdVar48 + 1;
    if (lVar49 == 9) {
      local_8b70._8_8_ = &local_5508;
      local_8b70._0_8_ = &local_7840;
      local_8b60 = (double *)&local_7840;
      memset(&local_2e80,0,0x1200);
      local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [0] = 1.0;
      Eigen::internal::
      generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
                ((Matrix<double,_24,_24,_1,_24,_24> *)&local_2e80,
                 (Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>
                  *)local_8b70,&local_7840,(Scalar *)&local_5280);
      lVar49 = 0x80;
      do {
        uVar17 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 8);
        uVar18 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x10);
        uVar19 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x18);
        uVar20 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x20);
        uVar21 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x28);
        uVar22 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x30);
        uVar23 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x38);
        uVar24 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x40);
        uVar25 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x48);
        uVar26 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x50);
        uVar27 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x58);
        uVar28 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x60);
        uVar29 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x68);
        uVar30 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x70);
        uVar31 = *(undefined8 *)((long)auStack_2f00 + lVar49 + 0x78);
        uVar32 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x80);
        uVar33 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x78);
        uVar34 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x70);
        uVar35 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x68);
        uVar36 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x60);
        uVar37 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x58);
        uVar38 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x50);
        uVar39 = *(undefined8 *)
                  ((long)local_2e80.Fint.
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                         m_data.array + lVar49 + -0x48);
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x80) = *(undefined8 *)((long)auStack_2f00 + lVar49);
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x78) = uVar17;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x70) = uVar18;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x68) = uVar19;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x60) = uVar20;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x58) = uVar21;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x50) = uVar22;
        *(undefined8 *)
         ((long)(&local_5280)[-1].super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                m_storage.m_data.array + lVar49) = uVar23;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x40) = uVar24;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x38) = uVar25;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x30) = uVar26;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x28) = uVar27;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x20) = uVar28;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x18) = uVar29;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -0x10) = uVar30;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + -8) = uVar31;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49) = uVar32;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 8) = uVar33;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 0x10) = uVar34;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 0x18) = uVar35;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 0x20) = uVar36;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 0x28) = uVar37;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 0x30) = uVar38;
        *(undefined8 *)
         ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + lVar49 + 0x38) = uVar39;
        lVar49 = lVar49 + 0xc0;
      } while (lVar49 != 0x1280);
      lVar49 = 0;
      do {
        uVar17 = *(undefined8 *)((long)local_4080 + lVar49 + 8);
        uVar18 = *(undefined8 *)((long)local_4080 + lVar49 + 0x10);
        uVar19 = *(undefined8 *)((long)local_4080 + lVar49 + 0x18);
        uVar20 = *(undefined8 *)((long)local_4080 + lVar49 + 0x20);
        uVar21 = *(undefined8 *)((long)local_4080 + lVar49 + 0x28);
        uVar22 = *(undefined8 *)((long)local_4080 + lVar49 + 0x30);
        uVar23 = *(undefined8 *)((long)local_4080 + lVar49 + 0x38);
        puVar47 = (undefined8 *)
                  ((long)(this->m_stock_KTE).
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                         m_data.array + lVar49);
        *puVar47 = *(undefined8 *)((long)local_4080 + lVar49);
        puVar47[1] = uVar17;
        puVar47[2] = uVar18;
        puVar47[3] = uVar19;
        puVar47[4] = uVar20;
        puVar47[5] = uVar21;
        puVar47[6] = uVar22;
        puVar47[7] = uVar23;
        uVar17 = *(undefined8 *)((long)local_4080 + lVar49 + 0x48);
        uVar18 = *(undefined8 *)((long)local_4080 + lVar49 + 0x50);
        uVar19 = *(undefined8 *)((long)local_4080 + lVar49 + 0x58);
        uVar20 = *(undefined8 *)((long)local_4080 + lVar49 + 0x60);
        uVar21 = *(undefined8 *)((long)local_4080 + lVar49 + 0x68);
        uVar22 = *(undefined8 *)((long)local_4080 + lVar49 + 0x70);
        uVar23 = *(undefined8 *)((long)local_4080 + lVar49 + 0x78);
        puVar47 = (undefined8 *)
                  ((long)(this->m_stock_KTE).
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                         m_data.array + lVar49 + 0x40);
        *puVar47 = *(undefined8 *)((long)local_4080 + lVar49 + 0x40);
        puVar47[1] = uVar17;
        puVar47[2] = uVar18;
        puVar47[3] = uVar19;
        puVar47[4] = uVar20;
        puVar47[5] = uVar21;
        puVar47[6] = uVar22;
        puVar47[7] = uVar23;
        uVar17 = *(undefined8 *)((long)local_4080 + lVar49 + 0x88);
        uVar18 = *(undefined8 *)((long)local_4080 + lVar49 + 0x90);
        uVar19 = *(undefined8 *)((long)local_4080 + lVar49 + 0x98);
        uVar20 = *(undefined8 *)((long)local_4080 + lVar49 + 0xa0);
        uVar21 = *(undefined8 *)((long)local_4080 + lVar49 + 0xa8);
        uVar22 = *(undefined8 *)((long)local_4080 + lVar49 + 0xb0);
        uVar23 = *(undefined8 *)((long)local_4080 + lVar49 + 0xb8);
        puVar47 = (undefined8 *)
                  ((long)(this->m_stock_KTE).
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                         m_data.array + lVar49 + 0x80);
        *puVar47 = *(undefined8 *)((long)local_4080 + lVar49 + 0x80);
        puVar47[1] = uVar17;
        puVar47[2] = uVar18;
        puVar47[3] = uVar19;
        puVar47[4] = uVar20;
        puVar47[5] = uVar21;
        puVar47[6] = uVar22;
        puVar47[7] = uVar23;
        lVar49 = lVar49 + 0xc0;
      } while (lVar49 != 0x1200);
      lVar49 = 0;
      do {
        uVar17 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 8);
        uVar18 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 0x10);
        uVar19 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 0x18);
        uVar20 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 0x20);
        uVar21 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 0x28);
        uVar22 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 0x30);
        uVar23 = *(undefined8 *)
                  ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar49 + 0x38);
        puVar47 = (undefined8 *)
                  ((long)(this->m_stock_jac_EAS).
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                         m_data.array + lVar49);
        *puVar47 = *(undefined8 *)
                    ((long)local_5280.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                           m_storage.m_data.array + lVar49);
        puVar47[1] = uVar17;
        puVar47[2] = uVar18;
        puVar47[3] = uVar19;
        puVar47[4] = uVar20;
        puVar47[5] = uVar21;
        puVar47[6] = uVar22;
        puVar47[7] = uVar23;
        uVar17 = *(undefined8 *)((long)auStack_5238 + lVar49);
        uVar18 = *(undefined8 *)((long)auStack_5238 + lVar49 + 8);
        uVar19 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x10);
        uVar20 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x18);
        uVar21 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x20);
        uVar22 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x28);
        uVar23 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x30);
        puVar47 = (undefined8 *)
                  ((long)(this->m_stock_jac_EAS).
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                         m_data.array + lVar49 + 0x40);
        *puVar47 = *(undefined8 *)((long)auStack_5238 + lVar49 + -8);
        puVar47[1] = uVar17;
        puVar47[2] = uVar18;
        puVar47[3] = uVar19;
        puVar47[4] = uVar20;
        puVar47[5] = uVar21;
        puVar47[6] = uVar22;
        puVar47[7] = uVar23;
        uVar17 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x40);
        uVar18 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x48);
        uVar19 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x50);
        uVar20 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x58);
        uVar21 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x60);
        uVar22 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x68);
        uVar23 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x70);
        puVar47 = (undefined8 *)
                  ((long)(this->m_stock_jac_EAS).
                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                         m_data.array + lVar49 + 0x80);
        *puVar47 = *(undefined8 *)((long)auStack_5238 + lVar49 + 0x38);
        puVar47[1] = uVar17;
        puVar47[2] = uVar18;
        puVar47[3] = uVar19;
        puVar47[4] = uVar20;
        puVar47[5] = uVar21;
        puVar47[6] = uVar22;
        puVar47[7] = uVar23;
        lVar49 = lVar49 + 0xc0;
      } while (lVar49 != 0x1200);
      return;
    }
  }
  goto LAB_006c7fca;
}

Assistant:

void ChElementHexaANCF_3813::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    int ie = GetElemNum();

    ChVector<> pA = m_nodes[0]->GetPos();
    ChVector<> pB = m_nodes[1]->GetPos();
    ChVector<> pC = m_nodes[2]->GetPos();
    ChVector<> pD = m_nodes[3]->GetPos();
    ChVector<> pE = m_nodes[4]->GetPos();
    ChVector<> pF = m_nodes[5]->GetPos();
    ChVector<> pG = m_nodes[6]->GetPos();
    ChVector<> pH = m_nodes[7]->GetPos();

    ChMatrixNM<double, 8, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = pB.x();
    d(1, 1) = pB.y();
    d(1, 2) = pB.z();
    d(2, 0) = pC.x();
    d(2, 1) = pC.y();
    d(2, 2) = pC.z();
    d(3, 0) = pD.x();
    d(3, 1) = pD.y();
    d(3, 2) = pD.z();
    d(4, 0) = pE.x();
    d(4, 1) = pE.y();
    d(4, 2) = pE.z();
    d(5, 0) = pF.x();
    d(5, 1) = pF.y();
    d(5, 2) = pF.z();
    d(6, 0) = pG.x();
    d(6, 1) = pG.y();
    d(6, 2) = pG.z();
    d(7, 0) = pH.x();
    d(7, 1) = pH.y();
    d(7, 2) = pH.z();

    double v = m_Material->Get_v();
    double E = m_Material->Get_E();

    Fi.setZero();

    /// If numerical differentiation is used, only the internal force and EAS stiffness
    /// will be calculated. If the numerical differentiation is not used, the jacobian
    /// will also be calculated.
    bool use_numerical_differentiation = false;

    /// Internal force and EAS parameters are calculated for numerical differentiation.
    if (use_numerical_differentiation) {
        //////////////////////////////////////////////////////////////////////////////////////////////////////////
        ChVectorN<double, 330> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;

        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        /// Begin EAS loop
        while (fail == 1) {
            /// Update alpha EAS
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();
            HE.setZero();
            GDEPSP.setZero();
            KALPHA.setZero();

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);
            //== F_internal ==//
            // Choose constructors depending on m_isMooney
            Brick_ForceNumerical myformula =
                !m_isMooney ? Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 330>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            ///===============================================================//
            ///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            ///===TempIntegratedResult(24:32,1) -> HE(9x1)   brick   =========//
            ///===TempIntegratedResult(33:248,1) -> GDEPSP(9x24)     =========//
            ///===TempIntegratedResult(249:329,1) -> KALPHA(9x9)     =========//
            ///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            GDEPSP = Eigen::Map<ChMatrixNM<double, 9, 24>>(GDEPSPvec.data(), 9, 24);
            KALPHA = Eigen::Map<ChMatrixNM<double, 9, 9>>(KALPHAvec.data(), 9, 9);
            KALPHA1 = KALPHA;

            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();

            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
            if (m_flag_HE == ANALYTICAL && count > 2) {
                GetLog() << ie << "  count " << count << "  NormHE " << norm_HE << "\n";
            }
        }
        Fi = -Finternal;
        //== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        //== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    } else {
        ////////////////////////////////////////////////////////////////////////////////////////////////////////////

        ChVectorN<double, 906> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;
        // Enhanced Assumed Strain (EAS)
        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 24, 24> KTE;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        // Loop to obtain convergence in EAS internal parameters alpha
        // This loops call ChQuadrature::Integrate3D on MyAnalyticalForce,
        // which calculates the Jacobian at every iteration of each time step
        int iteralpha = 0;  //  Counts number of iterations
        while (fail == 1) {
            iteralpha++;
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();  // Internal force vector
            HE.setZero();         // Internal force vector from EAS
            GDEPSP.setZero();     // Jacobian of EAS forces w.r.t. coordinates
            KALPHA.setZero();     // Jacobian of EAS forces w.r.t. EAS internal parameters

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);

            //== F_internal ==//
            Brick_ForceAnalytical myformula =
                !m_isMooney ? Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 906>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            //	///===============================================================//
            //	///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            //	///===TempIntegratedResult(24:28,1) -> HE(5x1)           =========//
            //	///===TempIntegratedResult(29:148,1) -> GDEPSP(5x24)     =========//
            //	///===TempIntegratedResult(149:173,1) -> KALPHA(5x5)     =========//
            //	///===TempIntegratedResult(174:749,1) -> Stiffness Matrix(24x24) =//
            //	///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            ChVectorN<double, 576> JACvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            JACvec = TempIntegratedResult.segment(330, 576);
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 24; j++) {
                    GDEPSP(i, j) = GDEPSPvec(i * 24 + j);
                }
            }
            // GDEPSP = GDEPSPvec;
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 9; j++) {
                    KALPHA(i, j) = KALPHAvec(i * 9 + j);
                }
            }
            // KALPHA = KALPHAvec;
            for (int i = 0; i < 24; i++) {
                for (int j = 0; j < 24; j++) {
                    KTE(i, j) = JACvec(i * 24 + j);
                }
            }
            // KTE = JACvec;

            // Calculation of the element Jacobian for implicit integrator
            // KTE and stock_jac_EAS_elem.
            KALPHA1 = KALPHA;
            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();
            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
        }  // end of while
        Fi = -Finternal;
        ////== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        ////== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_KTE = KTE;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    }  // end of else for numerical or analytical
}